

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O2

double __thiscall CDT::predict(CDT *this,vector<double,_std::allocator<double>_> *inputs)

{
  pointer pdVar1;
  uint col;
  double dVar2;
  double dVar3;
  
  pdVar1 = (inputs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar2 = 0.0;
  for (col = 0; (ulong)col <
                (ulong)((long)(inputs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)pdVar1 >> 3); col = col + 1)
  {
    dVar3 = Matrix<double>::get(&((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_weights,0,col);
    pdVar1 = (inputs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar2 = dVar2 + dVar3 * pdVar1[col];
  }
  dVar2 = Activation::run(&this->m_function,dVar2);
  return dVar2;
}

Assistant:

double CDT::predict(const std::vector<double>& inputs) const{
    // std::cout<<"Prediction for (";
    // for(unsigned i=0;i<inputs.size();++i){
    //     std::cout<<inputs[i]<<" ";
    // }
    // std::cout<<"): ";

    return feed_forward(inputs);
}